

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int canvas_getconns(t_object *objsrc,int *outno,t_object *objsink,int *inno)

{
  int iVar1;
  int iVar2;
  int local_54;
  int which;
  _inlet *in;
  t_object *o;
  _outconnect *oc;
  _outlet *out;
  int n;
  int count;
  int *inno_local;
  t_object *objsink_local;
  int *outno_local;
  t_object *objsrc_local;
  
  out._4_4_ = 0;
  _n = inno;
  inno_local = (int *)objsink;
  objsink_local = (t_object *)outno;
  outno_local = (int *)objsrc;
  for (out._0_4_ = 0; iVar1 = (int)out, iVar2 = obj_noutlets((t_object *)outno_local), iVar1 < iVar2
      ; out._0_4_ = (int)out + 1) {
    oc = (_outconnect *)0x0;
    o = (t_object *)obj_starttraverseoutlet((t_object *)outno_local,(_outlet **)&oc,(int)out);
    while (o != (t_object *)0x0) {
      o = (t_object *)
          obj_nexttraverseoutlet
                    ((_outconnect *)o,(t_object **)&in,(_inlet **)&stack0xffffffffffffffb0,&local_54
                    );
      if (in == (_inlet *)inno_local) {
        *(int *)&(objsink_local->te_g).g_pd = (int)out;
        *_n = local_54;
        out._4_4_ = out._4_4_ + 1;
      }
    }
  }
  return out._4_4_;
}

Assistant:

static int canvas_getconns(t_object*objsrc, int *outno, t_object*objsink, int *inno)
{
    int count = 0;
    int n;
    for(n=0; n<obj_noutlets(objsrc); n++)
    {
        t_outlet*out = 0;
        t_outconnect *oc = obj_starttraverseoutlet(objsrc, &out, n);
        while(oc)
        {
            t_object*o;
            t_inlet*in;
            int which;
            oc = obj_nexttraverseoutlet(oc, &o, &in, &which);
            if(o == objsink)
                *outno = n, *inno = which, count++;
        }
    }
    return count;
}